

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

void __thiscall icu_63::ICUService::ICUService(ICUService *this,UnicodeString *newName)

{
  ICUNotifier::ICUNotifier(&this->super_ICUNotifier);
  (this->super_ICUNotifier)._vptr_ICUNotifier = (_func_int **)&PTR__ICUService_003f4c30;
  UnicodeString::UnicodeString(&this->name,newName);
  this->timestamp = 0;
  this->factories = (UVector *)0x0;
  this->serviceCache = (Hashtable *)0x0;
  this->idCache = (Hashtable *)0x0;
  this->dnCache = (DNCache *)0x0;
  return;
}

Assistant:

ICUService::ICUService(const UnicodeString& newName) 
: name(newName)
, timestamp(0)
, factories(NULL)
, serviceCache(NULL)
, idCache(NULL)
, dnCache(NULL)
{
}